

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

Decoration __thiscall
anon_unknown.dwarf_a4b191::TGlslangToSpvTraverser::TranslateNonUniformDecoration
          (TGlslangToSpvTraverser *this,CoherentFlags *coherentFlags)

{
  Decoration DVar1;
  
  DVar1 = DecorationMax;
  if ((coherentFlags->field_0x1 & 4) != 0) {
    spv::Builder::addIncorporatedExtension(&this->builder,"SPV_EXT_descriptor_indexing",Spv_1_5);
    spv::Builder::addCapability(&this->builder,CapabilityShaderNonUniform);
    DVar1 = DecorationNonUniform;
  }
  return DVar1;
}

Assistant:

spv::Decoration TGlslangToSpvTraverser::TranslateNonUniformDecoration(
    const spv::Builder::AccessChain::CoherentFlags& coherentFlags)
{
    if (coherentFlags.isNonUniform()) {
        builder.addIncorporatedExtension("SPV_EXT_descriptor_indexing", spv::Spv_1_5);
        builder.addCapability(spv::CapabilityShaderNonUniformEXT);
        return spv::DecorationNonUniformEXT;
    } else
        return spv::DecorationMax;
}